

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O0

void __thiscall Firework::update(Firework *this)

{
  bool bVar1;
  reference this_00;
  const_iterator local_50;
  Particle *local_48;
  __normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_> local_40;
  __normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_> local_38;
  iterator it;
  Particle *particle;
  iterator __end2;
  iterator __begin2;
  vector<Particle,_std::allocator<Particle>_> *__range2;
  Firework *this_local;
  
  if ((this->exploded & 1U) == 0) {
    Particle::update(&this->rocket);
    if (0.0 <= (this->rocket).velocity.field_0.field_0.y) {
      explode(this);
    }
  }
  else {
    __end2 = std::vector<Particle,_std::allocator<Particle>_>::begin(&this->particles);
    particle = (Particle *)std::vector<Particle,_std::allocator<Particle>_>::end(&this->particles);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>
                                       *)&particle), bVar1) {
      it._M_current =
           __gnu_cxx::
           __normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>::
           operator*(&__end2);
      glm::vec<2,float,(glm::qualifier)0>::operator*=
                ((vec<2,float,(glm::qualifier)0> *)&(it._M_current)->velocity,0.95);
      Particle::update(it._M_current);
      __gnu_cxx::__normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>::
      operator++(&__end2);
    }
    local_38._M_current =
         (Particle *)std::vector<Particle,_std::allocator<Particle>_>::begin(&this->particles);
    while( true ) {
      local_40._M_current =
           (Particle *)std::vector<Particle,_std::allocator<Particle>_>::end(&this->particles);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>::
                operator*(&local_38);
      bVar1 = Particle::isDead(this_00);
      if (bVar1) {
        __gnu_cxx::__normal_iterator<Particle_const*,std::vector<Particle,std::allocator<Particle>>>
        ::__normal_iterator<Particle*>
                  ((__normal_iterator<Particle_const*,std::vector<Particle,std::allocator<Particle>>>
                    *)&local_50,&local_38);
        local_48 = (Particle *)
                   std::vector<Particle,_std::allocator<Particle>_>::erase
                             (&this->particles,local_50);
        local_38._M_current = local_48;
      }
      else {
        __gnu_cxx::__normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>
        ::operator++(&local_38,0);
      }
    }
  }
  return;
}

Assistant:

void Firework::update() {
    if (!exploded) {
        rocket.update();
        if (rocket.velocity.y >= 0.0f) {
            explode();
        }
    } else {
        for (Particle& particle : particles) {
            particle.velocity *= 0.95;
            particle.update();
        }
        std::vector<Particle>::iterator it = particles.begin();
        while(it != particles.end()) {
            if ((*it).isDead()) {
                it = particles.erase(it);
            } else {
                it++;
            }
        }
    }
}